

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O2

string * __thiscall
HevcSpsUnit::getDescription_abi_cxx11_(string *__return_storage_ptr__,HevcSpsUnit *this)

{
  allocator<char> local_102;
  allocator<char> local_101;
  double local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  double fps;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  HevcUnitWithProfile::getProfileString_abi_cxx11_
            (__return_storage_ptr__,&this->super_HevcUnitWithProfile);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98," Resolution: ",&local_101)
  ;
  int32uToStr_abi_cxx11_(&local_38,&this->pic_width_in_luma_samples);
  std::operator+(&local_d8,&local_98,&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,":",&local_102);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fps,&local_d8
                 ,&local_58);
  int32uToStr_abi_cxx11_(&local_78,&this->pic_height_in_luma_samples);
  std::operator+(&local_f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fps
                 ,&local_78);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&fps);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_98);
  if ((this->super_HevcUnitWithProfile).interlaced_source_flag == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"i",(allocator<char> *)&local_d8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"p",(allocator<char> *)&local_d8);
  }
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_f8);
  local_100 = 0.0;
  if (this->num_units_in_tick != 0) {
    local_100 = (double)this->time_scale / (double)this->num_units_in_tick;
  }
  fps = local_100;
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((local_100 != 0.0) || (NAN(local_100))) {
    doubleToStr_abi_cxx11_(&local_f8,&fps,-1);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"not found",(allocator<char> *)&local_98);
  }
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_f8);
  return __return_storage_ptr__;
}

Assistant:

string HevcSpsUnit::getDescription() const
{
    string result = getProfileString();
    result += string(" Resolution: ") + int32uToStr(pic_width_in_luma_samples) + string(":") +
              int32uToStr(pic_height_in_luma_samples);
    result += interlaced_source_flag ? string("i") : string("p");

    const double fps = getFPS();
    result += "  Frame rate: ";
    result += fps != 0.0 ? doubleToStr(fps) : string("not found");
    return result;
}